

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFrequencyGetProperties(zes_freq_handle_t hFrequency,zes_freq_properties_t *pProperties)

{
  zes_pfnFrequencyGetProperties_t pfnGetProperties;
  ze_result_t result;
  zes_freq_properties_t *pProperties_local;
  zes_freq_handle_t hFrequency_local;
  
  pfnGetProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cc10 != (code *)0x0) {
    pfnGetProperties._4_4_ = (*DAT_0011cc10)(hFrequency,pProperties);
  }
  return pfnGetProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyGetProperties(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        zes_freq_properties_t* pProperties              ///< [in,out] The frequency properties for the specified domain.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetProperties = context.zesDdiTable.Frequency.pfnGetProperties;
        if( nullptr != pfnGetProperties )
        {
            result = pfnGetProperties( hFrequency, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }